

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

void xmlTextReaderStructuredRelay(void *userData,xmlError *error)

{
  undefined4 local_24;
  xmlParserSeverities severity;
  xmlTextReaderPtr reader;
  xmlError *error_local;
  void *userData_local;
  
  if (*(long *)((long)userData + 0x148) == 0) {
    if (*(long *)((long)userData + 0xc0) != 0) {
      if ((error->domain == 0x17) || (error->domain == 4)) {
        if (error->level == XML_ERR_WARNING) {
          local_24 = 1;
        }
        else {
          local_24 = 2;
        }
      }
      else if (error->level == XML_ERR_WARNING) {
        local_24 = 3;
      }
      else {
        local_24 = 4;
      }
      (**(code **)((long)userData + 0xc0))
                (*(undefined8 *)((long)userData + 200),error->message,local_24,
                 *(undefined8 *)((long)userData + 0x20));
    }
  }
  else {
    (**(code **)((long)userData + 0x148))(*(undefined8 *)((long)userData + 200),error);
  }
  return;
}

Assistant:

static void
xmlTextReaderStructuredRelay(void *userData, const xmlError *error)
{
    xmlTextReaderPtr reader = (xmlTextReaderPtr) userData;

    if (reader->sErrorFunc != NULL) {
        reader->sErrorFunc(reader->errorFuncArg, error);
    } else if (reader->errorFunc != NULL) {
        xmlParserSeverities severity;

        if ((error->domain == XML_FROM_VALID) ||
            (error->domain == XML_FROM_DTD)) {
            if (error->level == XML_ERR_WARNING)
                severity = XML_PARSER_SEVERITY_VALIDITY_WARNING;
            else
                severity = XML_PARSER_SEVERITY_VALIDITY_ERROR;
        } else {
            if (error->level == XML_ERR_WARNING)
                severity = XML_PARSER_SEVERITY_WARNING;
            else
                severity = XML_PARSER_SEVERITY_ERROR;
        }

        reader->errorFunc(reader->errorFuncArg, error->message, severity,
                          reader->ctxt);
    }
}